

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_copy_extensions(nifti_image *nim_dest,nifti_image *nim_src)

{
  uint uVar1;
  nifti1_extension *pnVar2;
  char *__dest;
  uint local_38;
  int old_size;
  int size;
  int c;
  size_t bytes;
  char *data;
  nifti_image *nim_src_local;
  nifti_image *nim_dest_local;
  
  if ((nim_dest->num_ext < 1) && (nim_dest->ext_list == (nifti1_extension *)0x0)) {
    if (1 < g_opts.debug) {
      fprintf(_stderr,"+d duplicating %d extension(s)\n",(ulong)(uint)nim_src->num_ext);
    }
    if (nim_src->num_ext < 1) {
      nim_dest_local._4_4_ = 0;
    }
    else {
      pnVar2 = (nifti1_extension *)malloc((long)nim_src->num_ext << 4);
      nim_dest->ext_list = pnVar2;
      if (nim_dest->ext_list == (nifti1_extension *)0x0) {
        fprintf(_stderr,"** failed to allocate %d nifti1_extension structs\n",
                (ulong)(uint)nim_src->num_ext);
        nim_dest_local._4_4_ = -1;
      }
      else {
        nim_dest->num_ext = 0;
        for (old_size = 0; old_size < nim_src->num_ext; old_size = old_size + 1) {
          uVar1 = nim_src->ext_list[old_size].esize;
          local_38 = uVar1;
          if ((uVar1 & 0xf) != 0) {
            local_38 = uVar1 + 0xf & 0xfffffff0;
          }
          if (2 < g_opts.debug) {
            fprintf(_stderr,"+d dup\'ing ext #%d of size %d (from size %d)\n",(ulong)(uint)old_size,
                    (ulong)local_38,(ulong)uVar1);
          }
          __dest = (char *)calloc((long)(int)(local_38 - 8),1);
          if (__dest == (char *)0x0) {
            fprintf(_stderr,"** failed to alloc %d bytes for extention\n",(ulong)local_38);
            if (old_size == 0) {
              free(nim_dest->ext_list);
              nim_dest->ext_list = (nifti1_extension *)0x0;
            }
            return -1;
          }
          nim_dest->ext_list[old_size].esize = local_38;
          nim_dest->ext_list[old_size].ecode = nim_src->ext_list[old_size].ecode;
          nim_dest->ext_list[old_size].edata = __dest;
          memcpy(__dest,nim_src->ext_list[old_size].edata,(long)(int)(uVar1 - 8));
          nim_dest->num_ext = nim_dest->num_ext + 1;
        }
        nim_dest_local._4_4_ = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"** will not copy extensions over existing ones\n");
    nim_dest_local._4_4_ = -1;
  }
  return nim_dest_local._4_4_;
}

Assistant:

int nifti_copy_extensions(nifti_image * nim_dest, const nifti_image * nim_src)
{
   char   * data;
   size_t   bytes;
   int      c, size, old_size;

   if( nim_dest->num_ext > 0 || nim_dest->ext_list != NULL ){
      fprintf(stderr,"** will not copy extensions over existing ones\n");
      return -1;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d duplicating %d extension(s)\n", nim_src->num_ext);

   if( nim_src->num_ext <= 0 ) return 0;

   bytes = nim_src->num_ext * sizeof(nifti1_extension);  /* I'm lazy */
   nim_dest->ext_list = (nifti1_extension *)malloc(bytes);
   if( !nim_dest->ext_list ){
      fprintf(stderr,"** failed to allocate %d nifti1_extension structs\n",
              nim_src->num_ext);
      return -1;
   }

   /* copy the extension data */
   nim_dest->num_ext = 0;
   for( c = 0; c < nim_src->num_ext; c++ ){
      size = old_size = nim_src->ext_list[c].esize;
      if( size & 0xf ) size = (size + 0xf) & ~0xf; /* make multiple of 16 */
      if( g_opts.debug > 2 )
         fprintf(stderr,"+d dup'ing ext #%d of size %d (from size %d)\n",
                 c, size, old_size);
      /* data length is size-8, as esize includes space for esize and ecode */
      data = (char *)calloc(size-8,sizeof(char));      /* maybe size > old */
      if( !data ){
         fprintf(stderr,"** failed to alloc %d bytes for extention\n", size);
         if( c == 0 ) { free(nim_dest->ext_list); nim_dest->ext_list = NULL; }
         /* otherwise, keep what we have (a.o.t. deleting them all) */
         return -1;
      }
      /* finally, fill the new structure */
      nim_dest->ext_list[c].esize = size;
      nim_dest->ext_list[c].ecode = nim_src->ext_list[c].ecode;
      nim_dest->ext_list[c].edata = data;
      memcpy(data, nim_src->ext_list[c].edata, old_size-8);

      nim_dest->num_ext++;
   }

   return 0;
}